

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int populate_description_metadata(MMDB_s *mmdb,MMDB_s *metadata_db,MMDB_entry_s *metadata_start)

{
  uint uVar1;
  MMDB_entry_data_list_s *entry_data_list;
  MMDB_description_s **ppMVar2;
  MMDB_description_s *pMVar3;
  char *pcVar4;
  uint local_98;
  uint32_t i;
  uint32_t map_size;
  MMDB_entry_data_list_s *first_member;
  MMDB_entry_data_list_s *member;
  MMDB_entry_s map_start;
  char *pcStack_68;
  int status;
  char *path [2];
  MMDB_entry_data_s entry_data;
  MMDB_entry_s *metadata_start_local;
  MMDB_s *metadata_db_local;
  MMDB_s *mmdb_local;
  
  pcStack_68 = "description";
  path[0] = (char *)0x0;
  map_start._12_4_ =
       MMDB_aget_value(metadata_start,(MMDB_entry_data_s *)(path + 1),&stack0xffffffffffffff98);
  mmdb_local._4_4_ = map_start._12_4_;
  if (map_start._12_4_ == 0) {
    if (entry_data.offset_to_next == 7) {
      member = (MMDB_entry_data_list_s *)metadata_db;
      map_start._12_4_ = MMDB_get_entry_data_list((MMDB_entry_s *)&member,&first_member);
      entry_data_list = first_member;
      mmdb_local._4_4_ = map_start._12_4_;
      if (map_start._12_4_ == 0) {
        uVar1 = (first_member->entry_data).data_size;
        (mmdb->metadata).description.count = 0;
        if (uVar1 == 0) {
          (mmdb->metadata).description.descriptions = (MMDB_description_s **)0x0;
        }
        else {
          ppMVar2 = (MMDB_description_s **)calloc((ulong)uVar1,8);
          (mmdb->metadata).description.descriptions = ppMVar2;
          if ((mmdb->metadata).description.descriptions == (MMDB_description_s **)0x0) {
            map_start._12_4_ = 5;
          }
          else {
            for (local_98 = 0; local_98 < uVar1; local_98 = local_98 + 1) {
              pMVar3 = (MMDB_description_s *)calloc(1,0x10);
              (mmdb->metadata).description.descriptions[local_98] = pMVar3;
              if ((mmdb->metadata).description.descriptions[local_98] == (MMDB_description_s *)0x0)
              {
                map_start._12_4_ = 5;
                break;
              }
              (mmdb->metadata).description.count = (ulong)(local_98 + 1);
              (mmdb->metadata).description.descriptions[local_98]->language = (char *)0x0;
              (mmdb->metadata).description.descriptions[local_98]->description = (char *)0x0;
              first_member = first_member->next;
              if ((first_member->entry_data).type != 2) {
                map_start._12_4_ = 3;
                break;
              }
              pcVar4 = mmdb_strndup((first_member->entry_data).field_1.utf8_string,
                                    (ulong)(first_member->entry_data).data_size);
              (mmdb->metadata).description.descriptions[local_98]->language = pcVar4;
              if ((mmdb->metadata).description.descriptions[local_98]->language == (char *)0x0) {
                map_start._12_4_ = 5;
                break;
              }
              first_member = first_member->next;
              if ((first_member->entry_data).type != 2) {
                map_start._12_4_ = 3;
                break;
              }
              pcVar4 = mmdb_strndup((first_member->entry_data).field_1.utf8_string,
                                    (ulong)(first_member->entry_data).data_size);
              (mmdb->metadata).description.descriptions[local_98]->description = pcVar4;
              if ((mmdb->metadata).description.descriptions[local_98]->description == (char *)0x0) {
                map_start._12_4_ = 5;
                break;
              }
            }
          }
        }
        MMDB_free_entry_data_list(entry_data_list);
        mmdb_local._4_4_ = map_start._12_4_;
      }
    }
    else {
      mmdb_local._4_4_ = 3;
    }
  }
  return mmdb_local._4_4_;
}

Assistant:

static int populate_description_metadata(MMDB_s *mmdb,
                                         MMDB_s *metadata_db,
                                         MMDB_entry_s *metadata_start) {
    MMDB_entry_data_s entry_data;

    const char *path[] = {"description", NULL};
    int status = MMDB_aget_value(metadata_start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }

    if (MMDB_DATA_TYPE_MAP != entry_data.type) {
        DEBUG_MSGF("Unexpected entry_data type: %d", entry_data.type);
        return MMDB_INVALID_METADATA_ERROR;
    }

    MMDB_entry_s map_start = {.mmdb = metadata_db, .offset = entry_data.offset};

    MMDB_entry_data_list_s *member;
    status = MMDB_get_entry_data_list(&map_start, &member);
    if (MMDB_SUCCESS != status) {
        DEBUG_MSGF(
            "MMDB_get_entry_data_list failed while populating description."
            " status = %d (%s)",
            status,
            MMDB_strerror(status));
        return status;
    }

    MMDB_entry_data_list_s *first_member = member;

    uint32_t map_size = member->entry_data.data_size;
    mmdb->metadata.description.count = 0;
    if (0 == map_size) {
        mmdb->metadata.description.descriptions = NULL;
        goto cleanup;
    }
    MAYBE_CHECK_SIZE_OVERFLOW(map_size,
                              SIZE_MAX / sizeof(MMDB_description_s *),
                              MMDB_INVALID_METADATA_ERROR);

    mmdb->metadata.description.descriptions =
        calloc(map_size, sizeof(MMDB_description_s *));
    if (NULL == mmdb->metadata.description.descriptions) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    for (uint32_t i = 0; i < map_size; i++) {
        mmdb->metadata.description.descriptions[i] =
            calloc(1, sizeof(MMDB_description_s));
        if (NULL == mmdb->metadata.description.descriptions[i]) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
            goto cleanup;
        }

        mmdb->metadata.description.count = i + 1;
        mmdb->metadata.description.descriptions[i]->language = NULL;
        mmdb->metadata.description.descriptions[i]->description = NULL;

        member = member->next;

        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            status = MMDB_INVALID_METADATA_ERROR;
            goto cleanup;
        }

        mmdb->metadata.description.descriptions[i]->language = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.description.descriptions[i]->language) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
            goto cleanup;
        }

        member = member->next;

        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            status = MMDB_INVALID_METADATA_ERROR;
            goto cleanup;
        }

        mmdb->metadata.description.descriptions[i]->description = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.description.descriptions[i]->description) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
            goto cleanup;
        }
    }

cleanup:
    MMDB_free_entry_data_list(first_member);

    return status;
}